

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall
llm_tokenizer_ugm_session::normalize
          (llm_tokenizer_ugm_session *this,string *input,string *normalized)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  pointer pcVar4;
  _Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_> _Var5;
  bool bVar6;
  byte bVar7;
  size_t input_offset;
  byte bVar8;
  ulong uVar9;
  string space;
  normalization_result norm_res;
  long *local_88 [2];
  long local_78 [2];
  string *local_68;
  llm_tokenizer_ugm_session *local_60;
  size_type local_58;
  size_t local_50;
  normalization_result local_48;
  
  normalized->_M_string_length = 0;
  *(normalized->_M_dataplus)._M_p = '\0';
  local_68 = input;
  std::__cxx11::string::reserve((ulong)normalized);
  local_88[0] = local_78;
  if (*(char *)((long)(this->vocab->pimpl)._M_t.
                      super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                      .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x52) == '\x01') {
    pcVar4 = (this->tokenizer->escaped_space)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar4,pcVar4 + (this->tokenizer->escaped_space)._M_string_length)
    ;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88," ","");
  }
  _Var5.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl =
       (this->vocab->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>;
  if (*(char *)((long)_Var5.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl + 0x53)
      == '\0') {
    cVar1 = *(char *)((long)_Var5.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                     0x4c);
    cVar2 = '\0';
  }
  else {
    cVar1 = '\0';
    cVar2 = *(char *)((long)_Var5.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                     0x4c);
  }
  local_58 = local_68->_M_string_length;
  if (local_58 != 0) {
    bVar3 = *(byte *)((long)_Var5.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                     0x51);
    input_offset = 0;
    bVar6 = false;
    bVar8 = 0;
    local_60 = this;
    do {
      local_50 = input_offset;
      normalize_prefix(&local_48,local_60,local_68,input_offset);
      if (local_48.normalized_len != 0) {
        uVar9 = 0;
        do {
          if (local_48.normalized[uVar9] == ' ') {
            if (bVar6) {
              bVar6 = false;
            }
            if (bVar3 == 0) {
              std::__cxx11::string::_M_append((char *)normalized,(ulong)local_88[0]);
            }
          }
          else {
            if (!bVar6) {
              bVar7 = bVar3;
              if (cVar1 != '\0') {
                bVar7 = (~bVar8 | bVar3) & 1;
              }
              bVar6 = true;
              if (bVar7 != 0) {
                bVar8 = 1;
                std::__cxx11::string::_M_append((char *)normalized,(ulong)local_88[0]);
                bVar6 = true;
              }
            }
            std::__cxx11::string::push_back((char)normalized);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < local_48.normalized_len);
      }
      input_offset = local_50 + local_48.consumed_input;
    } while (input_offset < local_58);
  }
  if (cVar2 != '\0') {
    std::__cxx11::string::_M_append((char *)normalized,(ulong)local_88[0]);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return;
}

Assistant:

void normalize(const std::string& input, std::string * normalized) {
        normalized->clear();
        normalized->reserve(input.size() * 3);

        const std::string space = vocab.get_escape_whitespaces() ? tokenizer.escaped_space : " ";

        const bool shall_prepend_space = !vocab.get_treat_whitespace_as_suffix() && vocab.get_add_space_prefix();
        const bool shall_append_space  =  vocab.get_treat_whitespace_as_suffix() && vocab.get_add_space_prefix();
        const bool shall_merge_spaces  =  vocab.get_remove_extra_whitespaces();

        bool is_space_prepended = false;
        bool processing_non_ws = false;

        size_t input_len = input.size();

        for (size_t input_offset = 0; input_offset < input_len; ) {
            auto norm_res = normalize_prefix(input, input_offset);
            for (size_t i = 0; i < norm_res.normalized_len; i++) {
                char c = norm_res.normalized[i];
                if (c != ' ') {
                    if (!processing_non_ws) {
                        processing_non_ws = true;
                        if ((shall_prepend_space && !is_space_prepended) || shall_merge_spaces) {
                            normalized->append(space);
                            is_space_prepended = true;
                        }
                    }
                    normalized->push_back(c);
                } else {
                    if (processing_non_ws) {
                        processing_non_ws = false;
                    }
                    if (!shall_merge_spaces) {
                        normalized->append(space);
                    }
                }
            }

            input_offset += norm_res.consumed_input;
        }

        if (shall_append_space) {
            normalized->append(space);
        }
    }